

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O2

void Res_WinComputeRoots_rec(Abc_Obj_t *pNode,int nLevelMax,int nFanoutLimit,Vec_Ptr_t *vRoots)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,200,"void Res_WinComputeRoots_rec(Abc_Obj_t *, int, int, Vec_Ptr_t *)");
  }
  iVar2 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar2 != 0) {
    return;
  }
  Abc_NodeSetTravIdCurrent(pNode);
  uVar3 = (pNode->vFanouts).nSize;
  if ((int)uVar3 <= nFanoutLimit) {
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)uVar3;
    }
    do {
      if (uVar5 == uVar4) {
        for (lVar6 = 0; lVar6 < (int)uVar3; lVar6 = lVar6 + 1) {
          Res_WinComputeRoots_rec
                    ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar6]],
                     nLevelMax,nFanoutLimit,vRoots);
          uVar3 = (pNode->vFanouts).nSize;
        }
        return;
      }
      uVar1 = *(uint *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[uVar4]] + 0x14);
    } while (((int)(uVar1 >> 0xc) <= nLevelMax) && (uVar4 = uVar4 + 1, 1 < (uVar1 & 0xf) - 3));
  }
  Vec_PtrPush(vRoots,pNode);
  return;
}

Assistant:

void Res_WinComputeRoots_rec( Abc_Obj_t * pNode, int nLevelMax, int nFanoutLimit, Vec_Ptr_t * vRoots )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjIsNode(pNode) );
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    // check if the node should be the root
    if ( Res_WinComputeRootsCheck( pNode, nLevelMax, nFanoutLimit ) )
        Vec_PtrPush( vRoots, pNode );
    else // if not, explore its fanouts
        Abc_ObjForEachFanout( pNode, pFanout, i )
            Res_WinComputeRoots_rec( pFanout, nLevelMax, nFanoutLimit, vRoots );
}